

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GetMemberOfVectorOfNonStruct
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  size_t t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  Type local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_c0.base_type = (field->value).type.element;
  local_c0.fixed_length = (field->value).type.fixed_length;
  local_c0.element = BASE_TYPE_NONE;
  local_c0.struct_def = (field->value).type.struct_def;
  local_c0.enum_def = (field->value).type.enum_def;
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[6])(&local_100,&this->namer_,field);
  std::operator+(&local_120," ",&local_100);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  TypeName_abi_cxx11_(&local_e0,this,field);
  std::operator+(&local_100,"(j int) ",&local_e0);
  std::operator+(&local_120,&local_100," ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  OffsetPrefix_abi_cxx11_(&local_120,this,field);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::append((char *)code_ptr);
  GenGetter_abi_cxx11_(&local_40,this,&(field->value).type);
  std::operator+(&local_80,&local_40,"(a + flatbuffers.UOffsetT(j*");
  t = InlineSize(&local_c0);
  NumToString<unsigned_long>(&local_a0,t);
  std::operator+(&local_e0,&local_80,&local_a0);
  std::operator+(&local_60,&local_e0,"))");
  CastToEnum(&local_100,this,&(field->value).type,&local_60);
  std::operator+(&local_120,"\t\treturn ",&local_100);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GetMemberOfVectorOfNonStruct(const StructDef &struct_def,
                                    const FieldDef &field,
                                    std::string *code_ptr) {
    std::string &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "(j int) " + TypeName(field) + " ";
    code += OffsetPrefix(field);
    code += "\t\ta := rcv._tab.Vector(o)\n";
    code += "\t\treturn " +
            CastToEnum(field.value.type,
                       GenGetter(field.value.type) +
                           "(a + flatbuffers.UOffsetT(j*" +
                           NumToString(InlineSize(vectortype)) + "))");
    code += "\n\t}\n";
    if (IsString(vectortype)) {
      code += "\treturn nil\n";
    } else if (vectortype.base_type == BASE_TYPE_BOOL) {
      code += "\treturn false\n";
    } else {
      code += "\treturn 0\n";
    }
    code += "}\n\n";
  }